

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O1

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextBlock
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  int iVar1;
  undefined4 extraout_var;
  allocator_type local_39;
  void *local_38 [2];
  long local_28;
  ulong uVar2;
  
  if (this->m_cachePos == 0) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
    iVar1 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar2 = CONCAT44(extraout_var,iVar1);
    if (uVar2 == 0) {
      return false;
    }
    if (uVar2 < this->m_cacheSize) {
      this->m_cacheSize = uVar2;
    }
    this->m_filePos = this->m_filePos + this->m_cacheSize;
    this->m_blockIdx = this->m_blockIdx + 1;
    this->m_cachePos = 0;
    if (uVar2 == 0) {
      return false;
    }
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)local_38,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_39);
    std::vector<char,_std::allocator<char>_>::_M_move_assign
              (buffer,(vector<char,std::allocator<char>> *)local_38);
    if (local_38[0] != (void *)0x0) {
      operator_delete(local_38[0],local_28 - (long)local_38[0]);
    }
  }
  else {
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)local_38,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               ((this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + this->m_cachePos),
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_39);
    std::vector<char,_std::allocator<char>_>::_M_move_assign
              (buffer,(vector<char,std::allocator<char>> *)local_38);
    if (local_38[0] != (void *)0x0) {
      operator_delete(local_38[0],local_28 - (long)local_38[0]);
    }
    this->m_cachePos = 0;
  }
  return true;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextBlock( std::vector<T> &buffer) {
    // Return the last block-value if getNextLine was used before
    if ( 0 != m_cachePos ) {      
        buffer = std::vector<T>( m_cache.begin() + m_cachePos, m_cache.end() );
        m_cachePos = 0;
    } else {
        if ( !readNextBlock() ) {
            return false;
        }

        buffer = std::vector<T>(m_cache.begin(), m_cache.end());
    }

    return true;
}